

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O2

bool __thiscall QMdi::ControllerWidget::event(ControllerWidget *this,QEvent *event)

{
  long lVar1;
  bool bVar2;
  SubControl subControl;
  long in_FS_OFFSET;
  QStyleOptionComplex opt;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(short *)(event + 8) == 0x6e) {
    opt._64_8_ = &DAT_aaaaaaaaaaaaaaaa;
    opt.super_QStyleOption.palette._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    opt.super_QStyleOption.styleObject = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
    opt.super_QStyleOption._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
    opt.super_QStyleOption.palette.d = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
    opt.super_QStyleOption.rect._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    opt.super_QStyleOption.rect._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    opt.super_QStyleOption._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    opt.super_QStyleOption._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QStyleOptionComplex::QStyleOptionComplex(&opt,1,0xf0000);
    initStyleOption(this,&opt);
    subControl = getSubControl(this,(QPoint *)(event + 0x10));
    showToolTip((QHelpEvent *)event,&this->super_QWidget,&opt,CC_MdiControls,subControl);
    QStyleOption::~QStyleOption(&opt.super_QStyleOption);
  }
  bVar2 = QWidget::event(&this->super_QWidget,event);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool ControllerWidget::event(QEvent *event)
{
#if QT_CONFIG(tooltip)
    if (event->type() == QEvent::ToolTip) {
        QStyleOptionComplex opt;
        initStyleOption(&opt);
        QHelpEvent *helpEvent = static_cast<QHelpEvent *>(event);
        showToolTip(helpEvent, this, opt, QStyle::CC_MdiControls, getSubControl(helpEvent->pos()));
    }
#endif // QT_CONFIG(tooltip)
    return QWidget::event(event);
}